

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCheck.c
# Opt level: O1

int Ivy_ManCheckFanouts(Ivy_Man_t *p)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  Vec_Ptr_t *vArray;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  Ivy_Obj_t *pIVar10;
  
  if (p->fFanout == 0) {
    return 1;
  }
  vArray = (Vec_Ptr_t *)malloc(0x10);
  vArray->nCap = 100;
  vArray->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vArray->pArray = ppvVar5;
  pVVar6 = p->vObjs;
  if (pVVar6->nSize < 1) {
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    lVar9 = 0;
    do {
      puVar2 = (uint *)pVVar6->pArray[lVar9];
      if ((puVar2 != (uint *)0x0) &&
         (pIVar10 = (Ivy_Obj_t *)(*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe),
         pIVar10 != (Ivy_Obj_t *)0x0)) {
        Ivy_ObjCollectFanouts(p,pIVar10,vArray);
        uVar1 = vArray->nSize;
        if ((int)uVar1 < 1) {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          do {
            if (((uint *)vArray->pArray[uVar7] == (uint *)0x0) ||
               ((uint *)vArray->pArray[uVar7] == puVar2)) goto LAB_007873c5;
            uVar7 = uVar7 + 1;
          } while (uVar1 != uVar7);
          uVar7 = (ulong)uVar1;
        }
LAB_007873c5:
        if ((uint)uVar7 == uVar1) {
          iVar4 = 0;
          printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                 (ulong)(uint)pIVar10->Id,(ulong)*puVar2);
        }
        pIVar10 = (Ivy_Obj_t *)(*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe);
        if (pIVar10 != (Ivy_Obj_t *)0x0) {
          Ivy_ObjCollectFanouts(p,pIVar10,vArray);
          uVar1 = vArray->nSize;
          if ((int)uVar1 < 1) {
            uVar7 = 0;
          }
          else {
            uVar7 = 0;
            do {
              if (((uint *)vArray->pArray[uVar7] == (uint *)0x0) ||
                 ((uint *)vArray->pArray[uVar7] == puVar2)) goto LAB_00787427;
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
            uVar7 = (ulong)uVar1;
          }
LAB_00787427:
          if ((uint)uVar7 == uVar1) {
            iVar4 = 0;
            printf("Node %d is a fanin of node %d but the fanout is not there.\n",
                   (ulong)(uint)pIVar10->Id,(ulong)*puVar2);
          }
          puVar3 = *(uint **)(puVar2 + 0xe);
          if (puVar3 != (uint *)0x0) {
            if (((((*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe) !=
                   (*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe)) &&
                 ((*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe) !=
                  (*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe))) &&
                ((*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe))) &&
               ((*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe) !=
                (*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe))) {
              iVar4 = 0;
              printf("Node %d has prev %d without common fanin.\n",(ulong)*puVar2,(ulong)*puVar3);
            }
          }
          puVar3 = *(uint **)(puVar2 + 0x10);
          if (puVar3 != (uint *)0x0) {
            if ((((*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe) !=
                  (*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe)) &&
                ((*(ulong *)(puVar3 + 4) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe))) &&
               (((*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe) &&
                ((*(ulong *)(puVar3 + 6) & 0xfffffffffffffffe) !=
                 (*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe))))) {
              iVar4 = 0;
              printf("Node %d has prev %d without common fanin.\n",(ulong)*puVar2,(ulong)*puVar3);
            }
          }
        }
      }
      lVar9 = lVar9 + 1;
      pVVar6 = p->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pIVar10 = (Ivy_Obj_t *)pVVar6->pArray[lVar9];
      if ((pIVar10 != (Ivy_Obj_t *)0x0) &&
         (Ivy_ObjCollectFanouts(p,pIVar10,vArray), 0 < vArray->nSize)) {
        lVar8 = 0;
        do {
          puVar2 = (uint *)vArray->pArray[lVar8];
          if (puVar2 == (uint *)0x0) break;
          if ((pIVar10 != (Ivy_Obj_t *)(*(ulong *)(puVar2 + 4) & 0xfffffffffffffffe)) &&
             (pIVar10 != (Ivy_Obj_t *)(*(ulong *)(puVar2 + 6) & 0xfffffffffffffffe))) {
            iVar4 = 0;
            printf("Node %d is a fanout of node %d but the fanin is not there.\n",(ulong)*puVar2,
                   (ulong)(uint)pIVar10->Id);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < vArray->nSize);
      }
      lVar9 = lVar9 + 1;
      pVVar6 = p->vObjs;
    } while (lVar9 < pVVar6->nSize);
  }
  if (vArray->pArray != (void **)0x0) {
    free(vArray->pArray);
    vArray->pArray = (void **)0x0;
  }
  free(vArray);
  return iVar4;
}

Assistant:

int Ivy_ManCheckFanouts( Ivy_Man_t * p )
{
    Vec_Ptr_t * vFanouts;
    Ivy_Obj_t * pObj, * pFanout, * pFanin;
    int i, k, RetValue = 1;
    if ( !p->fFanout )
        return 1;
    vFanouts = Vec_PtrAlloc( 100 );
    // make sure every fanin is a fanout
    Ivy_ManForEachObj( p, pObj, i )
    {
        pFanin = Ivy_ObjFanin0(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }

        pFanin = Ivy_ObjFanin1(pObj);
        if ( pFanin == NULL )
            continue;
        Ivy_ObjForEachFanout( p, pFanin, vFanouts, pFanout, k )
            if ( pFanout == pObj )
                break;
        if ( k == Vec_PtrSize(vFanouts) )
        {
            printf( "Node %d is a fanin of node %d but the fanout is not there.\n", pFanin->Id, pObj->Id );
            RetValue = 0;
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan0 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan0) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan0->Id );
                RetValue = 0;
            }
        }
        // check that the previous fanout has the same fanin
        if ( pObj->pPrevFan1 )
        {
            if ( Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin0(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin0(pObj) && 
                 Ivy_ObjFanin1(pObj->pPrevFan1) != Ivy_ObjFanin1(pObj) )
            {
                printf( "Node %d has prev %d without common fanin.\n", pObj->Id, pObj->pPrevFan1->Id );
                RetValue = 0;
            }
        }
    }
    // make sure every fanout is a fanin
    Ivy_ManForEachObj( p, pObj, i )
    {
        Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, k )
            if ( Ivy_ObjFanin0(pFanout) != pObj && Ivy_ObjFanin1(pFanout) != pObj )
            {
                printf( "Node %d is a fanout of node %d but the fanin is not there.\n", pFanout->Id, pObj->Id );
                RetValue = 0;
            }
    }
    Vec_PtrFree( vFanouts );
    return RetValue;
}